

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall
Fad<Fad<double>>::
Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>,Fad<Fad<double>>>>>>,FadExpr<FadBinaryAdd<Fad<Fad<double>>,Fad<Fad<double>>>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
          *fadexpr)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *pFVar5;
  FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *pFVar6;
  uint uVar7;
  ulong *puVar8;
  Fad<double> *this_00;
  ulong uVar9;
  long lVar10;
  long lVar11;
  value_type local_50;
  
  FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
  ::val((value_type *)(this + 8),&fadexpr->fadexpr_);
  pFVar4 = (((fadexpr->fadexpr_).left_)->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 <= (int)uVar2) {
    uVar3 = uVar2;
  }
  pFVar6 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar6->fadexpr_).left_)->dx_).num_elts;
  uVar7 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar2) {
    uVar7 = uVar2;
  }
  if ((int)uVar7 < (int)uVar3) {
    uVar7 = uVar3;
  }
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  if (0 < (int)uVar7) {
    *(uint *)(this + 0x28) = uVar7;
    lVar11 = (ulong)uVar7 * 0x20;
    puVar8 = (ulong *)operator_new__(lVar11 + 8);
    *puVar8 = (ulong)uVar7;
    lVar10 = 0;
    this_00 = (Fad<double> *)(puVar8 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar10 = lVar10 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar10 != lVar11);
    *(Fad<double> **)(this + 0x30) = (Fad<double> *)(puVar8 + 1);
  }
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  pFVar4 = (((fadexpr->fadexpr_).left_)->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 <= (int)uVar2) {
    uVar3 = uVar2;
  }
  pFVar6 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar6->fadexpr_).left_)->dx_).num_elts;
  uVar7 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar2) {
    uVar7 = uVar2;
  }
  if ((int)uVar7 < (int)uVar3) {
    uVar7 = uVar3;
  }
  if (0 < (int)uVar7) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
      ::dx(&local_50,&fadexpr->fadexpr_,(int)uVar9);
      lVar11 = *(long *)(this + 0x30);
      pdVar1 = (double *)(lVar10 + lVar11);
      *pdVar1 = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&local_50.dx_);
      *(double *)(lVar11 + 0x18 + lVar10) = local_50.defaultVal;
      Fad<double>::~Fad(&local_50);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (uVar7 != uVar9);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }